

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbf_tests.cpp
# Opt level: O2

CTransactionRef __thiscall
rbf_tests::make_tx(rbf_tests *this,
                  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *inputs,vector<long,_std::allocator<long>_> *output_values)

{
  undefined8 *puVar1;
  uchar *puVar2;
  long lVar3;
  pointer psVar4;
  long lVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  pointer plVar9;
  CScript *this_00;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar10;
  long lVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  CTransactionRef CVar13;
  unsigned_long local_98;
  CMutableTransaction tx;
  CScriptWitness witness;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction(&tx);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            (&tx.vin,(long)(inputs->
                           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(inputs->
                           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 4);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            (&tx.vout,(long)(output_values->super__Vector_base<long,_std::allocator<long>_>)._M_impl
                            .super__Vector_impl_data._M_finish -
                      (long)(output_values->super__Vector_base<long,_std::allocator<long>_>)._M_impl
                            .super__Vector_impl_data._M_start >> 3);
  lVar11 = 0x50;
  lVar10 = 0;
  for (uVar12 = 0;
      psVar4 = (inputs->
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar12 < (ulong)((long)(inputs->
                             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)psVar4 >> 4);
      uVar12 = uVar12 + 1) {
    lVar5 = *(long *)((long)&(psVar4->
                             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr + lVar10);
    uVar6 = *(undefined8 *)(lVar5 + 0x39);
    uVar7 = *(undefined8 *)(lVar5 + 0x41);
    uVar8 = *(undefined8 *)(lVar5 + 0x51);
    puVar1 = (undefined8 *)
             ((long)(&((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_start)->prevout).hash + -2) + lVar11);
    *puVar1 = *(undefined8 *)(lVar5 + 0x49);
    puVar1[1] = uVar8;
    puVar2 = ((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
             m_data._M_elems + lVar11 + -0x50;
    *(undefined8 *)puVar2 = uVar6;
    *(undefined8 *)(puVar2 + 8) = uVar7;
    puVar2 = ((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
             m_data._M_elems + lVar11 + -0x30;
    puVar2[0] = '\0';
    puVar2[1] = '\0';
    puVar2[2] = '\0';
    puVar2[3] = '\0';
    witness.stack.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    witness.stack.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    witness.stack.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98 = uVar12 + 10;
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::emplace_back<unsigned_long>(&witness.stack,&local_98);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator=((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)(((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.
                    super_base_blob<256U>.m_data._M_elems + lVar11),&witness.stack);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::~vector(&witness.stack);
    lVar11 = lVar11 + 0x68;
    lVar10 = lVar10 + 0x10;
  }
  plVar9 = (output_values->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar11 = 8;
  for (uVar12 = 0;
      uVar12 < (ulong)((long)(output_values->super__Vector_base<long,_std::allocator<long>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)plVar9 >> 3);
      uVar12 = uVar12 + 1) {
    witness.stack.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    witness.stack.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    witness.stack.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    this_00 = CScript::operator<<((CScript *)&witness,OP_11);
    other = &CScript::operator<<(this_00,OP_EQUAL)->super_CScriptBase;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
               ((long)&(tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                        super__Vector_impl_data._M_start)->nValue + lVar11),other);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&witness);
    plVar9 = (output_values->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    *(long *)((long)tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar11 + -8) = plVar9[uVar12];
    lVar11 = lVar11 + 0x28;
  }
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)this);
  CMutableTransaction::~CMutableTransaction(&tx);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    CVar13.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    CVar13.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (CTransactionRef)
           CVar13.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>;
  }
  __stack_chk_fail();
}

Assistant:

static inline CTransactionRef make_tx(const std::vector<CTransactionRef>& inputs,
                                      const std::vector<CAmount>& output_values)
{
    CMutableTransaction tx = CMutableTransaction();
    tx.vin.resize(inputs.size());
    tx.vout.resize(output_values.size());
    for (size_t i = 0; i < inputs.size(); ++i) {
        tx.vin[i].prevout.hash = inputs[i]->GetHash();
        tx.vin[i].prevout.n = 0;
        // Add a witness so wtxid != txid
        CScriptWitness witness;
        witness.stack.emplace_back(i + 10);
        tx.vin[i].scriptWitness = witness;
    }
    for (size_t i = 0; i < output_values.size(); ++i) {
        tx.vout[i].scriptPubKey = CScript() << OP_11 << OP_EQUAL;
        tx.vout[i].nValue = output_values[i];
    }
    return MakeTransactionRef(tx);
}